

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

uint64_t OneStatPass(VP8Encoder *enc,VP8RDLevel rd_opt,int nb_mbs,int percent_delta,PassStats *s)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  long lVar4;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  long in_R8;
  double dVar5;
  undefined1 auVar6 [16];
  VP8ModeScore info;
  uint64_t pixel_count;
  uint64_t distortion;
  uint64_t size_p0;
  uint64_t size;
  VP8EncIterator it;
  undefined4 in_stack_ffffffffffffed38;
  float in_stack_ffffffffffffed3c;
  float fVar7;
  undefined4 in_stack_ffffffffffffed40;
  VP8RDLevel in_stack_ffffffffffffed44;
  VP8ModeScore *in_stack_ffffffffffffed48;
  undefined4 in_stack_ffffffffffffed50;
  int in_stack_ffffffffffffed54;
  VP8EncIterator *in_stack_ffffffffffffed58;
  uint8_t *in_stack_ffffffffffffed78;
  VP8EncProba *in_stack_ffffffffffffed80;
  VP8ModeScore *in_stack_ffffffffffffed88;
  VP8EncIterator *in_stack_ffffffffffffed90;
  long local_f40;
  uint8_t *local_f38;
  VP8EncIterator local_f30;
  long local_28;
  int local_1c;
  int local_18;
  long local_10;
  
  local_f38 = (uint8_t *)0x0;
  local_f40 = 0;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_10 = in_RDI;
  VP8IteratorInit((VP8Encoder *)CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                  (VP8EncIterator *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
  SetLoopParams((VP8Encoder *)CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                in_stack_ffffffffffffed3c);
  do {
    VP8IteratorImport((VP8EncIterator *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
    iVar1 = VP8Decimate((VP8EncIterator *)
                        CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50),
                        in_stack_ffffffffffffed48,in_stack_ffffffffffffed44);
    if (iVar1 != 0) {
      *(int *)(local_10 + 0x5bd0) = *(int *)(local_10 + 0x5bd0) + 1;
    }
    RecordResiduals(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
    local_f38 = in_stack_ffffffffffffed58->i4_boundary_ +
                (long)(local_f38 +
                      CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50) + -0x50);
    local_f40 = CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50) + local_f40;
    fVar7 = in_stack_ffffffffffffed3c;
    if ((local_1c != 0) &&
       (iVar1 = VP8IteratorProgress(in_stack_ffffffffffffed58,in_stack_ffffffffffffed54),
       fVar7 = in_stack_ffffffffffffed3c, iVar1 == 0)) {
      return 0;
    }
    VP8IteratorSaveBoundary(&local_f30);
    iVar1 = VP8IteratorNext((VP8EncIterator *)0x179c10);
    in_stack_ffffffffffffed3c = (float)((uint)fVar7 & 0xffffff);
    if (iVar1 != 0) {
      local_18 = local_18 + -1;
      in_stack_ffffffffffffed3c = (float)CONCAT13(0 < local_18,SUB43(fVar7,0));
    }
  } while ((char)((uint)in_stack_ffffffffffffed3c >> 0x18) != '\0');
  uVar3 = *(int *)(local_10 + 0x28) + local_f40;
  if (*(int *)(local_28 + 0x30) == 0) {
    dVar5 = GetPSNR(CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                    CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
    *(double *)(local_28 + 0x18) = dVar5;
  }
  else {
    iVar1 = FinalizeSkipProba((VP8Encoder *)
                              CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50));
    iVar2 = FinalizeTokenProbas(in_stack_ffffffffffffed80);
    lVar4 = ((ulong)(local_f38 + uVar3 + (long)iVar2 + (long)iVar1 + 0x400) >> 0xb) + 0x1e;
    auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = 0x45300000;
    *(double *)(local_28 + 0x18) =
         (auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
  }
  return uVar3;
}

Assistant:

static uint64_t OneStatPass(VP8Encoder* const enc, VP8RDLevel rd_opt,
                            int nb_mbs, int percent_delta,
                            PassStats* const s) {
  VP8EncIterator it;
  uint64_t size = 0;
  uint64_t size_p0 = 0;
  uint64_t distortion = 0;
  const uint64_t pixel_count = (uint64_t)nb_mbs * 384;

  VP8IteratorInit(enc, &it);
  SetLoopParams(enc, s->q);
  do {
    VP8ModeScore info;
    VP8IteratorImport(&it, NULL);
    if (VP8Decimate(&it, &info, rd_opt)) {
      // Just record the number of skips and act like skip_proba is not used.
      ++enc->proba_.nb_skip_;
    }
    RecordResiduals(&it, &info);
    size += info.R + info.H;
    size_p0 += info.H;
    distortion += info.D;
    if (percent_delta && !VP8IteratorProgress(&it, percent_delta)) {
      return 0;
    }
    VP8IteratorSaveBoundary(&it);
  } while (VP8IteratorNext(&it) && --nb_mbs > 0);

  size_p0 += enc->segment_hdr_.size_;
  if (s->do_size_search) {
    size += FinalizeSkipProba(enc);
    size += FinalizeTokenProbas(&enc->proba_);
    size = ((size + size_p0 + 1024) >> 11) + HEADER_SIZE_ESTIMATE;
    s->value = (double)size;
  } else {
    s->value = GetPSNR(distortion, pixel_count);
  }
  return size_p0;
}